

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

bool __thiscall
Rml::Context::ProcessMouseWheel(Context *this,Vector2f wheel_delta,int key_modifier_state)

{
  ScrollController *pSVar1;
  Vector2f delta_distance;
  Vector2f delta_distance_00;
  bool bVar2;
  type pVVar3;
  Element *in_target;
  Context *this_00;
  float fVar4;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar5;
  Dictionary scroll_parameters;
  Dictionary local_58;
  undefined1 local_38 [16];
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  pSVar1 = (this->scroll_controller)._M_t.
           super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
           ._M_t.
           super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
           .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl;
  if (pSVar1->mode == Autoscroll) {
    ScrollController::Reset(pSVar1);
    bVar2 = false;
  }
  else if (this->hover == (Element *)0x0) {
    ScrollController::Reset(pSVar1);
    bVar2 = true;
  }
  else {
    local_38._8_4_ = in_XMM0_Dc;
    local_38._0_8_ = wheel_delta;
    local_38._12_4_ = in_XMM0_Dd;
    local_58.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = this;
    GenerateMouseEventParameters(this,&local_58,-1);
    GenerateKeyModifierEventParameters(this_00,&local_58,key_modifier_state);
    pVVar3 = itlib::
             flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
             ::operator[]<char_const(&)[14]>
                       ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                         *)&local_58,(char (*) [14])"wheel_delta_x");
    Variant::Clear(pVVar3);
    Variant::Set(pVVar3,(float)local_38._0_4_);
    pVVar3 = itlib::
             flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
             ::operator[]<char_const(&)[14]>
                       ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                         *)&local_58,(char (*) [14])"wheel_delta_y");
    Variant::Clear(pVVar3);
    local_28 = (float)local_38._4_4_;
    fStack_24 = (float)local_38._4_4_;
    fStack_20 = (float)local_38._4_4_;
    fStack_1c = (float)local_38._4_4_;
    Variant::Set(pVVar3,(float)local_38._4_4_);
    bVar2 = Element::DispatchEvent(this->hover,Mousescroll,&local_58);
    if (bVar2) {
      fVar5 = this->density_independent_pixel_ratio;
      in_target = Element::GetClosestScrollableContainer(this->hover);
      fVar5 = fVar5 * 80.0;
      fVar4 = (float)local_38._0_4_ * fVar5;
      fVar5 = local_28 * fVar5;
      pSVar1 = (this->scroll_controller)._M_t.
               super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
               .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl;
      if ((pSVar1->mode == Smoothscroll) && (pSVar1->target == in_target)) {
        delta_distance.y = fVar5;
        delta_distance.x = fVar4;
        ScrollController::IncrementSmoothscrollTarget(pSVar1,delta_distance);
      }
      else {
        delta_distance_00.y = fVar5;
        delta_distance_00.x = fVar4;
        ScrollController::ActivateSmoothscroll(pSVar1,in_target,delta_distance_00,Auto);
      }
      bVar2 = in_target == (Element *)0x0;
    }
    else {
      bVar2 = false;
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&local_58.m_container);
  }
  return bVar2;
}

Assistant:

bool Context::ProcessMouseWheel(Vector2f wheel_delta, int key_modifier_state)
{
	if (scroll_controller->GetMode() == ScrollController::Mode::Autoscroll)
	{
		scroll_controller->Reset();
		return false;
	}
	else if (!hover)
	{
		scroll_controller->Reset();
		return true;
	}

	Dictionary scroll_parameters;
	GenerateMouseEventParameters(scroll_parameters);
	GenerateKeyModifierEventParameters(scroll_parameters, key_modifier_state);
	scroll_parameters["wheel_delta_x"] = wheel_delta.x;
	scroll_parameters["wheel_delta_y"] = wheel_delta.y;

	// Dispatch a mouse scroll event, this gives elements an opportunity to block scrolling from being performed.
	if (!hover->DispatchEvent(EventId::Mousescroll, scroll_parameters))
		return false;

	const float unit_scroll_length = UNIT_SCROLL_LENGTH * density_independent_pixel_ratio;
	const Vector2f scroll_length = wheel_delta * unit_scroll_length;
	Element* target = hover->GetClosestScrollableContainer();

	if (scroll_controller->GetMode() == ScrollController::Mode::Smoothscroll && scroll_controller->GetTarget() == target)
		scroll_controller->IncrementSmoothscrollTarget(scroll_length);
	else
		scroll_controller->ActivateSmoothscroll(target, scroll_length, ScrollBehavior::Auto);

	return target == nullptr;
}